

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

xmlParserErrors
xmllintResourceLoader
          (void *ctxt,char *URL,char *ID,xmlResourceType type,xmlParserInputFlags flags,
          xmlParserInputPtr *out)

{
  xmlParserErrors xVar1;
  char *pcVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  xmlParserErrors local_50;
  
  pcVar5 = URL;
  if ((URL != (char *)0x0) && (0 < *(int *)((long)ctxt + 0x338))) {
    for (pcVar2 = URL + 1;
        (pcVar6 = pcVar2, pcVar2[-1] == '/' || (pcVar6 = pcVar5, pcVar2[-1] != '\0'));
        pcVar2 = pcVar2 + 1) {
      pcVar5 = pcVar6;
    }
  }
  if (*(code **)((long)ctxt + 0x10) == (code *)0x0) {
    xVar1 = xmlNewInputFromUrl(URL,flags,out);
  }
  else {
    xVar1 = (**(code **)((long)ctxt + 0x10))(0,URL,ID,type,flags,out);
  }
  if (xVar1 == XML_IO_ENOENT) {
    xVar1 = XML_IO_ENOENT;
    if (0 < *(int *)((long)ctxt + 0x338)) {
      pcVar2 = "(null)";
      if (ID != (char *)0x0) {
        pcVar2 = ID;
      }
      lVar7 = 0;
      do {
        uVar3 = xmlStrdup(*(undefined8 *)((long)ctxt + lVar7 * 8 + 0x130));
        uVar3 = xmlStrcat(uVar3,"/");
        lVar4 = xmlStrcat(uVar3,pcVar5);
        if (lVar4 == 0) {
          bVar8 = true;
        }
        else {
          if (*(code **)((long)ctxt + 0x10) == (code *)0x0) {
            xVar1 = xmlNewInputFromUrl(lVar4,flags,out);
          }
          else {
            xVar1 = (**(code **)((long)ctxt + 0x10))(0,lVar4,ID,type,flags,out);
          }
          bVar8 = xVar1 == XML_IO_ENOENT;
          if (((!bVar8) && (local_50 = xVar1, xVar1 == XML_ERR_OK)) &&
             (*(int *)((long)ctxt + 0x33c) != 0)) {
            fprintf(*ctxt,"Loaded URL=\"%s\" ID=\"%s\"\n",lVar4,pcVar2);
          }
          (*_xmlFree)(lVar4);
        }
        if (!bVar8) {
          return local_50;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < *(int *)((long)ctxt + 0x338));
      xVar1 = XML_IO_ENOENT;
    }
  }
  else if ((xVar1 == XML_ERR_OK) && (*(int *)((long)ctxt + 0x33c) != 0)) {
    pcVar5 = "(null)";
    if (ID != (char *)0x0) {
      pcVar5 = ID;
    }
    fprintf(*ctxt,"Loaded URL=\"%s\" ID=\"%s\"\n",URL,pcVar5);
  }
  return xVar1;
}

Assistant:

static xmlParserErrors
xmllintResourceLoader(void *ctxt, const char *URL,
                      const char *ID, xmlResourceType type,
                      xmlParserInputFlags flags, xmlParserInputPtr *out) {
    xmllintState *lint = ctxt;
    xmlParserErrors code;
    int i;
    const char *lastsegment = URL;
    const char *iter = URL;

    if ((lint->nbpaths > 0) && (iter != NULL)) {
	while (*iter != 0) {
	    if (*iter == '/')
		lastsegment = iter + 1;
	    iter++;
	}
    }

    if (lint->defaultResourceLoader != NULL)
        code = lint->defaultResourceLoader(NULL, URL, ID, type, flags, out);
    else
        code = xmlNewInputFromUrl(URL, flags, out);
    if (code != XML_IO_ENOENT) {
        if ((lint->load_trace) && (code == XML_ERR_OK)) {
            fprintf(lint->errStream, "Loaded URL=\"%s\" ID=\"%s\"\n",
                    URL, ID ? ID : "(null)");
        }
        return(code);
    }

    for (i = 0; i < lint->nbpaths; i++) {
	xmlChar *newURL;

	newURL = xmlStrdup((const xmlChar *) lint->paths[i]);
	newURL = xmlStrcat(newURL, (const xmlChar *) "/");
	newURL = xmlStrcat(newURL, (const xmlChar *) lastsegment);
	if (newURL != NULL) {
            if (lint->defaultResourceLoader != NULL)
                code = lint->defaultResourceLoader(NULL, (const char *) newURL,
                                                   ID, type, flags, out);
            else
                code = xmlNewInputFromUrl((const char *) newURL, flags, out);
            if (code != XML_IO_ENOENT) {
                if ((lint->load_trace) && (code == XML_ERR_OK)) {
                    fprintf(lint->errStream, "Loaded URL=\"%s\" ID=\"%s\"\n",
                            newURL, ID ? ID : "(null)");
                }
	        xmlFree(newURL);
                return(code);
            }
	    xmlFree(newURL);
	}
    }

    return(XML_IO_ENOENT);
}